

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_fast_array_element(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  JSValue v;
  JSValue v_00;
  uint uVar1;
  int iVar2;
  JSShapeProperty *pJVar3;
  undefined8 *puVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined4 in_R8D;
  uint32_t array_len;
  uint32_t new_len;
  JSContext *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int local_20;
  undefined4 uStack_c;
  
  uVar1 = *(int *)(in_RSI + 0x40) + 1;
  if (((int)*(undefined8 *)(*(long *)(in_RSI + 0x20) + 8) == 0) &&
     (in_stack_ffffffffffffffb4 = **(uint **)(in_RSI + 0x20), in_stack_ffffffffffffffb4 < uVar1)) {
    pJVar3 = get_shape_prop(*(JSShape **)(in_RSI + 0x18));
    if ((*(uint *)pJVar3 >> 0x1a & 2) == 0) {
      v.u._4_4_ = in_stack_ffffffffffffffac;
      v.u.int32 = in_stack_ffffffffffffffa8;
      v.tag._0_4_ = in_stack_ffffffffffffffb0;
      v.tag._4_4_ = in_stack_ffffffffffffffb4;
      JS_FreeValue(in_stack_ffffffffffffffa0,v);
      iVar2 = JS_ThrowTypeErrorReadOnly
                        ((JSContext *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (JSAtom)in_stack_ffffffffffffffa0);
      return iVar2;
    }
    puVar4 = *(undefined8 **)(in_RSI + 0x20);
    in_stack_ffffffffffffffa0 = (JSContext *)CONCAT44(uStack_c,uVar1);
    in_stack_ffffffffffffffa8 = 0;
    in_stack_ffffffffffffffac = 0;
    *puVar4 = in_stack_ffffffffffffffa0;
    puVar4[1] = 0;
  }
  if ((*(uint *)(in_RSI + 0x30) < uVar1) &&
     (iVar2 = expand_fast_array((JSContext *)CONCAT44(in_R8D,uVar1),
                                (JSObject *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac), iVar2 != 0)) {
    v_00.u._4_4_ = in_stack_ffffffffffffffac;
    v_00.u.int32 = in_stack_ffffffffffffffa8;
    v_00.tag._0_4_ = in_stack_ffffffffffffffb0;
    v_00.tag._4_4_ = in_stack_ffffffffffffffb4;
    JS_FreeValue(in_stack_ffffffffffffffa0,v_00);
    local_20 = -1;
  }
  else {
    puVar4 = (undefined8 *)(*(long *)(in_RSI + 0x38) + (ulong)(uVar1 - 1) * 0x10);
    *puVar4 = in_RDX;
    puVar4[1] = in_RCX;
    *(uint *)(in_RSI + 0x40) = uVar1;
    local_20 = 1;
  }
  return local_20;
}

Assistant:

static int add_fast_array_element(JSContext *ctx, JSObject *p,
                                  JSValue val, int flags)
{
    uint32_t new_len, array_len;
    /* extend the array by one */
    /* XXX: convert to slow array if new_len > 2^31-1 elements */
    new_len = p->u.array.count + 1;
    /* update the length if necessary. We assume that if the length is
       not an integer, then if it >= 2^31.  */
    if (likely(JS_VALUE_GET_TAG(p->prop[0].u.value) == JS_TAG_INT)) {
        array_len = JS_VALUE_GET_INT(p->prop[0].u.value);
        if (new_len > array_len) {
            if (unlikely(!(get_shape_prop(p->shape)->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
            }
            p->prop[0].u.value = JS_NewInt32(ctx, new_len);
        }
    }
    if (unlikely(new_len > p->u.array.u1.size)) {
        if (expand_fast_array(ctx, p, new_len)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
    }
    p->u.array.u.values[new_len - 1] = val;
    p->u.array.count = new_len;
    return TRUE;
}